

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O2

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectEnterDenseCoDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol,int start,int incr)

{
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  pointer pnVar3;
  undefined8 uVar4;
  type_conflict5 tVar5;
  DataKey DVar6;
  long lVar7;
  long lVar8;
  undefined4 in_register_00000084;
  cpp_dec_float<50U,_int,_void> *v;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *a;
  int local_18c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_188;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_150;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  devexpr local_68 [8];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  pSVar1 = (this->
           super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).thesolver;
  pnVar2 = (pSVar1->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar3 = (pSVar1->weights).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)start;
  a = (pSVar1->theTest).val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start + lVar8;
  local_188.m_backend.fpclass = cpp_dec_float_finite;
  local_188.m_backend.prec_elem = 10;
  local_188.m_backend.data._M_elems[0] = 0;
  local_188.m_backend.data._M_elems[1] = 0;
  local_188.m_backend.data._M_elems[2] = 0;
  local_188.m_backend.data._M_elems[3] = 0;
  local_188.m_backend.data._M_elems[4] = 0;
  local_188.m_backend.data._M_elems[5] = 0;
  local_188.m_backend.data._M_elems._24_5_ = 0;
  local_188.m_backend.data._M_elems[7]._1_3_ = 0;
  local_188.m_backend.data._M_elems._32_5_ = 0;
  local_188.m_backend.data._M_elems[9]._1_3_ = 0;
  local_188.m_backend.exp = 0;
  local_188.m_backend.neg = false;
  lVar7 = (long)incr;
  v = &pnVar2[lVar8].m_backend;
  local_18c = -1;
  local_150 = best;
  for (; lVar8 < (int)(((long)pnVar3 - (long)pnVar2) / 0x38); lVar8 = lVar8 + lVar7) {
    uVar4 = *(undefined8 *)((a->m_backend).data._M_elems + 8);
    local_188.m_backend.data._M_elems._32_5_ = SUB85(uVar4,0);
    local_188.m_backend.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_188.m_backend.data._M_elems._0_8_ = *(undefined8 *)(a->m_backend).data._M_elems;
    local_188.m_backend.data._M_elems._8_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 2);
    local_188.m_backend.data._M_elems._16_8_ = *(undefined8 *)((a->m_backend).data._M_elems + 4);
    uVar4 = *(undefined8 *)((a->m_backend).data._M_elems + 6);
    local_188.m_backend.data._M_elems._24_5_ = SUB85(uVar4,0);
    local_188.m_backend.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
    local_188.m_backend.exp = (a->m_backend).exp;
    local_188.m_backend.neg = (a->m_backend).neg;
    local_188.m_backend.fpclass = (a->m_backend).fpclass;
    local_188.m_backend.prec_elem = (a->m_backend).prec_elem;
    result.m_backend.data._M_elems._32_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
    result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
    result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
    result.m_backend.data._M_elems._16_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
    result.m_backend.data._M_elems._24_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
    result.m_backend.exp = (feastol->m_backend).exp;
    result.m_backend.neg = (feastol->m_backend).neg;
    result.m_backend.fpclass = (feastol->m_backend).fpclass;
    result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
    if (result.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0)
    {
      result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
    }
    tVar5 = boost::multiprecision::operator<(a,&result);
    if (tVar5) {
      uStack_50 = CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                           local_188.m_backend.data._M_elems._24_5_);
      local_68 = (devexpr  [8])local_188.m_backend.data._M_elems._0_8_;
      auStack_60[0] = local_188.m_backend.data._M_elems[2];
      auStack_60[1] = local_188.m_backend.data._M_elems[3];
      local_58[0] = local_188.m_backend.data._M_elems[4];
      local_58[1] = local_188.m_backend.data._M_elems[5];
      local_48 = CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                          local_188.m_backend.data._M_elems._32_5_);
      local_40 = local_188.m_backend.exp;
      local_3c = local_188.m_backend.neg;
      local_38 = local_188.m_backend.fpclass;
      iStack_34 = local_188.m_backend.prec_elem;
      local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(v->data)._M_elems;
      local_a8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((v->data)._M_elems + 2);
      local_a8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((v->data)._M_elems + 4);
      local_a8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((v->data)._M_elems + 6);
      local_a8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((v->data)._M_elems + 8);
      local_a8.m_backend.exp = v->exp;
      local_a8.m_backend.neg = v->neg;
      local_a8.m_backend.fpclass = v->fpclass;
      local_a8.m_backend.prec_elem = v->prec_elem;
      local_e8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      local_e8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      local_e8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
      local_e8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      local_e8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      local_e8.m_backend.exp = (feastol->m_backend).exp;
      local_e8.m_backend.neg = (feastol->m_backend).neg;
      local_e8.m_backend.fpclass = (feastol->m_backend).fpclass;
      local_e8.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      devexpr::
      computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&result,local_68,&local_a8,&local_e8,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_register_00000084,incr));
      local_188.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
      local_188.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
      local_188.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
      local_188.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
      local_188.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
      local_188.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
      local_188.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
      local_188.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
      local_188.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
      local_188.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
      local_188.m_backend.exp = result.m_backend.exp;
      local_188.m_backend.neg = result.m_backend.neg;
      local_188.m_backend.fpclass = result.m_backend.fpclass;
      local_188.m_backend.prec_elem = result.m_backend.prec_elem;
      tVar5 = boost::multiprecision::operator>(&local_188,local_150);
      if (tVar5) {
        *(ulong *)((local_150->m_backend).data._M_elems + 8) =
             CONCAT35(local_188.m_backend.data._M_elems[9]._1_3_,
                      local_188.m_backend.data._M_elems._32_5_);
        *(undefined8 *)((local_150->m_backend).data._M_elems + 4) =
             local_188.m_backend.data._M_elems._16_8_;
        *(ulong *)((local_150->m_backend).data._M_elems + 6) =
             CONCAT35(local_188.m_backend.data._M_elems[7]._1_3_,
                      local_188.m_backend.data._M_elems._24_5_);
        *(undefined8 *)(local_150->m_backend).data._M_elems =
             local_188.m_backend.data._M_elems._0_8_;
        *(undefined8 *)((local_150->m_backend).data._M_elems + 2) =
             local_188.m_backend.data._M_elems._8_8_;
        (local_150->m_backend).exp = local_188.m_backend.exp;
        (local_150->m_backend).neg = local_188.m_backend.neg;
        (local_150->m_backend).fpclass = local_188.m_backend.fpclass;
        (local_150->m_backend).prec_elem = local_188.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(this->last).m_backend,v);
        local_18c = (int)lVar8;
      }
    }
    a = a + lVar7;
    v = v + lVar7;
  }
  if (local_18c < 0) {
    DVar6.info = 0;
    DVar6.idx = -1;
  }
  else {
    DVar6 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::id((this->
                          super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).thesolver,local_18c);
  }
  return (SPxId)DVar6;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}